

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::lookingAtDecimal(SelectionCompiler *this,bool param_2)

{
  int iVar1;
  char *pcVar2;
  long in_RDI;
  bool bVar3;
  char ch;
  bool digitSeen;
  int ichT;
  char local_1a;
  int local_18;
  bool local_1;
  
  if (*(int *)(in_RDI + 0xd8) == *(int *)(in_RDI + 0xd0)) {
    local_1 = false;
  }
  else {
    local_18 = *(int *)(in_RDI + 0xd8);
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
    if (*pcVar2 == '-') {
      local_18 = local_18 + 1;
    }
    local_1 = false;
    local_1a = 'X';
    while( true ) {
      bVar3 = false;
      if (local_18 < *(int *)(in_RDI + 0xd0)) {
        pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
        local_1a = *pcVar2;
        iVar1 = isdigit((int)local_1a);
        bVar3 = iVar1 != 0;
      }
      if (!bVar3) break;
      local_18 = local_18 + 1;
      local_1 = true;
    }
    if ((local_18 == *(int *)(in_RDI + 0xd0)) || (local_1a != '.')) {
      local_1 = false;
    }
    else {
      if (0 < local_18) {
        pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
        iVar1 = isalpha((int)*pcVar2);
        if (iVar1 != 0) {
          return false;
        }
      }
      while( true ) {
        local_18 = local_18 + 1;
        bVar3 = false;
        if (local_18 < *(int *)(in_RDI + 0xd0)) {
          pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI + 0x20);
          iVar1 = isdigit((int)*pcVar2);
          bVar3 = iVar1 != 0;
        }
        if (!bVar3) break;
        local_1 = true;
      }
      *(int *)(in_RDI + 0xdc) = local_18 - *(int *)(in_RDI + 0xd8);
    }
  }
  return local_1;
}

Assistant:

bool SelectionCompiler::lookingAtDecimal(bool) {
    if (ichToken == cchScript) { return false; }

    int ichT = ichToken;
    if (script[ichT] == '-') { ++ichT; }
    bool digitSeen = false;
    char ch        = 'X';
    while (ichT < cchScript && std::isdigit(ch = script[ichT])) {
      ++ichT;
      digitSeen = true;
    }

    if (ichT == cchScript || ch != '.') { return false; }

    // to support DMPC.1, let's check the character before the dot
    if (ch == '.' && (ichT > 0) && std::isalpha(script[ichT - 1])) {
      return false;
    }

    ++ichT;
    while (ichT < cchScript && std::isdigit(script[ichT])) {
      ++ichT;
      digitSeen = true;
    }
    cchToken = ichT - ichToken;
    return digitSeen;
  }